

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myentity.cpp
# Opt level: O2

void __thiscall MyEntity::MyEntity(MyEntity *this)

{
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"",&local_41);
  MetaSim::Entity::Entity(&this->super_Entity,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR__MyEntity_0017c738;
  this->afirst = false;
  this->bfirst = false;
  this->count = 0;
  MetaSim::GEvent<MyEntity>::GEvent(&this->eventA,this,0x13ef8e,0);
  MetaSim::GEvent<MyEntity>::GEvent(&this->eventB,this,0x13efbc,0);
  MetaSim::GEvent<MyEntity>::GEvent(&this->eventC,this,0x13efee,0);
  return;
}

Assistant:

MyEntity::MyEntity() : Entity(""),
		       afirst(false),
		       bfirst(false),
		       count(0),
		       eventA(this, &MyEntity::onEventA),
		       eventB(this, &MyEntity::onEventB),
		       eventC(this, &MyEntity::onEventC)
{
}